

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O1

RBFTransactionState IsRBFOptIn(CTransaction *tx,CTxMemPool *pool)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  CTxMemPoolEntry *pCVar5;
  CTxMemPoolEntry **ppCVar6;
  _Rb_tree_node_base *p_Var7;
  RBFTransactionState RVar8;
  long in_FS_OFFSET;
  string_view calling_fn_name;
  setEntries ancestors;
  Limits local_78;
  _Rb_tree<_270907ca_> local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = SignalsOptInRBF(tx);
  RVar8 = REPLACEABLE_BIP125;
  if (!bVar4) {
    local_58._M_impl._0_1_ = false;
    uVar1 = *(undefined8 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_58._M_impl.super__Rb_tree_header._M_header._1_8_ =
         *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    uVar2 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    uVar3 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    local_58._M_impl._1_7_ = SUB87(uVar1,0);
    local_58._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
         (undefined1)((ulong)uVar1 >> 0x38);
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = (undefined7)uVar2;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = (uchar)((ulong)uVar2 >> 0x38);
    local_58._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ = (undefined7)uVar3;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = (uchar)((ulong)uVar3 >> 0x38);
    bVar4 = CTxMemPool::exists(pool,(GenTxid *)&local_58);
    RVar8 = UNKNOWN;
    if (bVar4) {
      pCVar5 = CTxMemPool::GetEntry(pool,&tx->hash);
      local_58._M_impl._0_1_ = SUB81(pCVar5,0);
      local_58._M_impl._1_7_ = SUB87((ulong)pCVar5 >> 8,0);
      ppCVar6 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                          ((CTxMemPoolEntry **)&local_58,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/rbf.cpp"
                           ,0x29,"IsRBFOptIn","pool.GetEntry(tx.GetHash())");
      local_78.ancestor_count = 0x7fffffffffffffff;
      local_78.ancestor_size_vbytes = 0x7fffffffffffffff;
      local_78.descendant_count = 0x7fffffffffffffff;
      local_78.descendant_size_vbytes = 0x7fffffffffffffff;
      calling_fn_name._M_str = "IsRBFOptIn";
      calling_fn_name._M_len = 10;
      CTxMemPool::AssumeCalculateMemPoolAncestors
                ((setEntries *)&local_58,pool,calling_fn_name,*ppCVar6,&local_78,false);
      RVar8 = FINAL;
      for (p_Var7 = (_Rb_tree_node_base *)
                    CONCAT71(local_58._M_impl.super__Rb_tree_header._M_header._M_left._1_7_,
                             (uchar)local_58._M_impl.super__Rb_tree_header._M_header._M_left);
          (_Rb_tree_header *)p_Var7 != &local_58._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        bVar4 = SignalsOptInRBF((CTransaction *)**(undefined8 **)(p_Var7 + 1));
        if (bVar4) {
          RVar8 = REPLACEABLE_BIP125;
          break;
        }
      }
      std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return RVar8;
  }
  __stack_chk_fail();
}

Assistant:

RBFTransactionState IsRBFOptIn(const CTransaction& tx, const CTxMemPool& pool)
{
    AssertLockHeld(pool.cs);

    // First check the transaction itself.
    if (SignalsOptInRBF(tx)) {
        return RBFTransactionState::REPLACEABLE_BIP125;
    }

    // If this transaction is not in our mempool, then we can't be sure
    // we will know about all its inputs.
    if (!pool.exists(GenTxid::Txid(tx.GetHash()))) {
        return RBFTransactionState::UNKNOWN;
    }

    // If all the inputs have nSequence >= maxint-1, it still might be
    // signaled for RBF if any unconfirmed parents have signaled.
    const auto& entry{*Assert(pool.GetEntry(tx.GetHash()))};
    auto ancestors{pool.AssumeCalculateMemPoolAncestors(__func__, entry, CTxMemPool::Limits::NoLimits(),
                                                        /*fSearchForParents=*/false)};

    for (CTxMemPool::txiter it : ancestors) {
        if (SignalsOptInRBF(it->GetTx())) {
            return RBFTransactionState::REPLACEABLE_BIP125;
        }
    }
    return RBFTransactionState::FINAL;
}